

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O0

void __thiscall glslang::TIntermUnary::traverse(TIntermUnary *this,TIntermTraverser *it)

{
  int iVar1;
  byte local_19;
  bool visit;
  TIntermTraverser *it_local;
  TIntermUnary *this_local;
  
  local_19 = 1;
  if ((it->preVisit & 1U) != 0) {
    iVar1 = (*it->_vptr_TIntermTraverser[5])(it,0,this);
    local_19 = (byte)iVar1 & 1;
  }
  if (local_19 != 0) {
    TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
    (*(this->operand->super_TIntermNode)._vptr_TIntermNode[2])(this->operand,it);
    TIntermTraverser::decrementDepth(it);
    if ((it->postVisit & 1U) != 0) {
      (*it->_vptr_TIntermTraverser[5])(it,2,this);
    }
  }
  return;
}

Assistant:

void TIntermUnary::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitUnary(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);
        operand->traverse(it);
        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitUnary(EvPostVisit, this);
}